

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall Rml::Element::Project(Element *this,Vector2f *point)

{
  TransformState *this_00;
  Vector2f VVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  float fVar4;
  Matrix4f *pMVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  VectorType local_48;
  VectorType local_38;
  
  this_00 = (this->transform_state)._M_t.
            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
  bVar6 = true;
  if ((this_00 != (TransformState *)0x0) &&
     (pMVar5 = TransformState::GetTransform(this_00), pMVar5 != (Matrix4f *)0x0)) {
    pMVar5 = TransformState::GetInverseTransform
                       ((this->transform_state)._M_t.
                        super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                        .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl);
    if (pMVar5 != (Matrix4f *)0x0) {
      local_48.z = -10.0;
      local_48.x = point->x;
      local_48.y = point->y;
      local_48.w = 1.0;
      local_38.z = 10.0;
      local_38.x = point->x;
      local_38.y = point->y;
      local_38.w = 1.0;
      local_48 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
                 VectorMultiplier<float,_Rml::ColumnMajorStorage<float>_>::Multiply
                           (pMVar5,&local_48);
      local_38 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
                 VectorMultiplier<float,_Rml::ColumnMajorStorage<float>_>::Multiply
                           (pMVar5,&local_38);
      fVar13 = local_38.w;
      uVar9 = local_38._0_8_;
      fVar4 = local_48.w;
      fVar7 = local_48.z / local_48.w;
      uVar3 = local_48._0_8_;
      fVar12 = local_38.z / fVar13 - fVar7;
      fVar8 = Math::Absolute(fVar12);
      if (1.0 < fVar8) {
        auVar10._4_4_ = fVar4;
        auVar10._0_4_ = fVar4;
        auVar10._8_4_ = fVar4;
        auVar10._12_4_ = fVar4;
        auVar14._8_8_ = 0;
        local_48.x = (float)uVar3;
        local_48.y = SUB84(uVar3,4);
        auVar14._0_4_ = local_48.x;
        auVar14._4_4_ = local_48.y;
        auVar14 = divps(auVar14,auVar10);
        auVar2._8_8_ = extraout_XMM0_Qb;
        auVar2._0_8_ = uVar9;
        auVar11._4_4_ = fVar13;
        auVar11._0_4_ = fVar13;
        auVar11._8_4_ = fVar13;
        auVar11._12_4_ = fVar13;
        auVar11 = divps(auVar2,auVar11);
        fVar12 = -fVar7 / fVar12;
        VVar1.y = fVar12 * (auVar11._4_4_ - auVar14._4_4_) + auVar14._4_4_;
        VVar1.x = fVar12 * (auVar11._0_4_ - auVar14._0_4_) + auVar14._0_4_;
        *point = VVar1;
        return true;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Element::Project(Vector2f& point) const noexcept
{
	if (!transform_state || !transform_state->GetTransform())
		return true;

	// The input point is in window coordinates. Need to find the projection of the point onto the current element plane,
	// taking into account the full transform applied to the element.

	if (const Matrix4f* inv_transform = transform_state->GetInverseTransform())
	{
		// Pick two points forming a line segment perpendicular to the window.
		Vector4f window_points[2] = {{point.x, point.y, -10, 1}, {point.x, point.y, 10, 1}};

		// Project them into the local element space.
		window_points[0] = *inv_transform * window_points[0];
		window_points[1] = *inv_transform * window_points[1];

		Vector3f local_points[2] = {window_points[0].PerspectiveDivide(), window_points[1].PerspectiveDivide()};

		// Construct a ray from the two projected points in the local space of the current element.
		// Find the intersection with the z=0 plane to produce our destination point.
		Vector3f ray = local_points[1] - local_points[0];

		// Only continue if we are not close to parallel with the plane.
		if (Math::Absolute(ray.z) > 1.0f)
		{
			// Solving the line equation p = p0 + t*ray for t, knowing that p.z = 0, produces the following.
			float t = -local_points[0].z / ray.z;
			Vector3f p = local_points[0] + ray * t;

			point = Vector2f(p.x, p.y);
			return true;
		}
	}

	// The transformation matrix is either singular, or the ray is parallel to the element's plane.
	return false;
}